

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::ruby::GenerateEnumAssignment
          (ruby *this,string_view prefix,EnumDescriptor *en,Printer *printer)

{
  ushort *puVar1;
  long lVar2;
  ruby *this_00;
  string_view text;
  string_view text_00;
  string_view name;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = (char *)prefix._M_len;
  puVar1 = *(ushort **)(prefix._M_str + 8);
  this_00 = (ruby *)(ulong)*puVar1;
  name._M_len = ~(ulong)this_00 + (long)puVar1;
  name._M_str = (char *)en;
  local_30._M_len = (size_t)this;
  RubifyConstant_abi_cxx11_(&local_50,this_00,name);
  text._M_str = "$prefix$$name$ = ";
  text._M_len = 0x11;
  io::Printer::
  Print<char[7],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
            ((Printer *)en,text,(char (*) [7])0x13f1099,&local_30,(char (*) [5])0x10f3c63,&local_50)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar2 = *(long *)(prefix._M_str + 8);
  local_50._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(lVar2 + 2);
  local_50._M_string_length = ~(ulong)local_50._M_dataplus._M_p + lVar2;
  text_00._M_str =
       "::Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").enummodule\n";
  text_00._M_len = 0x53;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            ((Printer *)en,text_00,(char (*) [10])0x13f0d39,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  return;
}

Assistant:

void GenerateEnumAssignment(absl::string_view prefix, const EnumDescriptor* en,
                            io::Printer* printer) {
  printer->Print("$prefix$$name$ = ", "prefix", prefix, "name",
                 RubifyConstant(en->name()));
  printer->Print(
      "::Google::Protobuf::DescriptorPool.generated_pool."
      "lookup(\"$full_name$\").enummodule\n",
      "full_name", en->full_name());
}